

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void read_bytes<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *vec,size_t n_els,FILE **in)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(vec,n_els);
  std::vector<signed_char,_std::allocator<signed_char>_>::_M_shrink_to_fit(vec);
  if (n_els == 0) {
    return;
  }
  iVar1 = feof((FILE *)*in);
  if (iVar1 == 0) {
    sVar2 = fread((vec->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_start,1,n_els,(FILE *)*in);
    __stream = (FILE *)*in;
    if ((sVar2 == n_els) && (iVar1 = ferror(__stream), iVar1 == 0)) {
      return;
    }
    throw_ferror((FILE *)__stream);
  }
  throw_feoferr();
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, FILE *&in)
{
    vec.resize(n_els);
    vec.shrink_to_fit();
    
    if (n_els) {
        if (unlikely(feof(in))) throw_feoferr();
        size_t n_read = fread(vec.data(), sizeof(dtype), n_els, in);
        if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);
    }
}